

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Spatializer.cpp
# Opt level: O0

int Spatializer::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  UnityAudioSpatializerData *pUVar6;
  UnityAudioSpatializerData *pUVar7;
  bool bVar8;
  EffectData *pEVar9;
  int iVar10;
  long lVar11;
  float fVar12;
  float __x;
  float azimuth_00;
  float fVar13;
  float fVar14;
  float local_d4;
  float local_cc;
  float y;
  float s_1;
  int n_3;
  int n_2;
  int n_1;
  float right;
  float left;
  int n;
  InstanceChannel *ch;
  int local_98;
  float stereopan;
  int c;
  int sampleOffset;
  float *reverb;
  float local_80;
  float spreadmatrix [2];
  float spread;
  float reverbmix;
  float spatialblend;
  float elevation;
  float azimuth;
  float dir_z;
  float dir_y;
  float dir_x;
  float pz;
  float py;
  float px;
  float *s;
  float *m;
  EffectData *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  if ((((inchannels == 2) && (outchannels == 2)) && (bVar8 = IsHostCompatible(state), bVar8)) &&
     ((state->field_0).field_0.spatializerdata != (UnityAudioSpatializerData *)0x0)) {
    pEVar9 = UnityAudioEffectState::GetEffectData<Spatializer::EffectData>(state);
    pUVar6 = (state->field_0).field_0.spatializerdata;
    pUVar7 = (state->field_0).field_0.spatializerdata;
    fVar1 = pUVar7->sourcematrix[0xc];
    fVar13 = pUVar7->sourcematrix[0xd];
    fVar14 = pUVar7->sourcematrix[0xe];
    fVar12 = pUVar6->listenermatrix[8] * fVar14 +
             pUVar6->listenermatrix[0] * fVar1 + pUVar6->listenermatrix[4] * fVar13 +
             pUVar6->listenermatrix[0xc];
    fVar2 = pUVar6->listenermatrix[1];
    fVar3 = pUVar6->listenermatrix[5];
    fVar4 = pUVar6->listenermatrix[9];
    fVar5 = pUVar6->listenermatrix[0xd];
    __x = pUVar6->listenermatrix[10] * fVar14 +
          pUVar6->listenermatrix[2] * fVar1 + pUVar6->listenermatrix[6] * fVar13 +
          pUVar6->listenermatrix[0xe];
    if (0.001 <= ABS(__x)) {
      local_cc = atan2f(fVar12,__x);
    }
    else {
      local_cc = 0.0;
    }
    spatialblend = local_cc;
    if (local_cc < 0.0) {
      spatialblend = local_cc + 6.2831855;
    }
    azimuth_00 = FastClip(spatialblend * 57.295776,0.0,360.0);
    fVar12 = sqrtf(fVar12 * fVar12 + __x * __x);
    fVar13 = atan2f(fVar4 * fVar14 + fVar2 * fVar1 + fVar3 * fVar13 + fVar5,fVar12 + 0.001);
    fVar1 = ((state->field_0).field_0.spatializerdata)->spatialblend;
    spreadmatrix[1] = ((state->field_0).field_0.spatializerdata)->reverbzonemix;
    GetHRTF(0,pEVar9->ch[0].h,azimuth_00,fVar13 * 57.295776);
    GetHRTF(1,pEVar9->ch[1].h,azimuth_00,fVar13 * 57.295776);
    local_80 = cosf((((state->field_0).field_0.spatializerdata)->spread * 3.1415927) / 360.0);
    reverb._4_4_ = 2.0 - local_80;
    _c = reverbmixbuffer;
    spreadmatrix[0] = local_80;
    _inchannels_local = outbuffer;
    outbuffer_local = inbuffer;
    for (stereopan = 0.0; (uint)stereopan < length; stereopan = (float)((int)stereopan + 0x200)) {
      for (local_98 = 0; local_98 < 2; local_98 = local_98 + 1) {
        if (local_98 == 0) {
          local_d4 = FastMax(0.0,((state->field_0).field_0.spatializerdata)->stereopan);
        }
        else {
          local_d4 = FastMax(0.0,-((state->field_0).field_0.spatializerdata)->stereopan);
        }
        lVar11 = (long)local_98;
        for (right = 0.0; (int)right < 0x200; right = (float)((int)right + 1)) {
          fVar13 = outbuffer_local[(int)right << 1];
          fVar14 = outbuffer_local[(int)right * 2 + 1];
          pEVar9->ch[lVar11].buffer[(int)right] = pEVar9->ch[lVar11].buffer[(int)right + 0x200];
          pEVar9->ch[lVar11].buffer[(int)right + 0x200] =
               fVar13 * *(float *)((long)&reverb + (long)local_98 * 4 + 4) +
               fVar14 * *(float *)((long)&reverb + (long)(1 - local_98) * 4 + 4);
        }
        for (n_3 = 0; n_3 < 0x400; n_3 = n_3 + 1) {
          pEVar9->ch[lVar11].x[n_3].re = pEVar9->ch[lVar11].buffer[n_3];
          pEVar9->ch[lVar11].x[n_3].im = 0.0;
        }
        FFT::Forward(pEVar9->ch[lVar11].x,0x400,false);
        for (s_1 = 0.0; (int)s_1 < 0x400; s_1 = (float)((int)s_1 + 1)) {
          UnityComplexNumberT<float>::Mul<float,float,float>
                    (pEVar9->ch[lVar11].x + (int)s_1,pEVar9->ch[lVar11].h + (int)s_1,
                     pEVar9->ch[lVar11].y + (int)s_1);
        }
        FFT::Backward(pEVar9->ch[lVar11].y,0x400,false);
        for (y = 0.0; (int)y < 0x200; y = (float)((int)y + 1)) {
          fVar14 = outbuffer_local[(int)y * 2 + local_98] * (1.0 - local_d4);
          fVar13 = pEVar9->ch[lVar11].y[(int)y].re;
          fVar14 = (fVar13 + fVar13 + -fVar14) * fVar1 + fVar14;
          _inchannels_local[(int)y * 2 + local_98] = fVar14;
          iVar10 = (int)y * 2 + local_98;
          _c[iVar10] = fVar14 * spreadmatrix[1] + _c[iVar10];
        }
      }
      outbuffer_local = outbuffer_local + 0x400;
      _inchannels_local = _inchannels_local + 0x400;
      _c = _c + 0x400;
    }
  }
  else {
    memcpy(outbuffer,inbuffer,(ulong)(length * outchannels) << 2);
  }
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        // Check that I/O formats are right and that the host API supports this feature
        if (inchannels != 2 || outchannels != 2 ||
            !IsHostCompatible(state) || state->spatializerdata == NULL)
        {
            memcpy(outbuffer, inbuffer, length * outchannels * sizeof(float));
            return UNITY_AUDIODSP_OK;
        }

        EffectData* data = state->GetEffectData<EffectData>();

        static const float kRad2Deg = 180.0f / kPI;

        float* m = state->spatializerdata->listenermatrix;
        float* s = state->spatializerdata->sourcematrix;

        // Currently we ignore source orientation and only use the position
        float px = s[12];
        float py = s[13];
        float pz = s[14];

        float dir_x = m[0] * px + m[4] * py + m[8] * pz + m[12];
        float dir_y = m[1] * px + m[5] * py + m[9] * pz + m[13];
        float dir_z = m[2] * px + m[6] * py + m[10] * pz + m[14];

        float azimuth = (fabsf(dir_z) < 0.001f) ? 0.0f : atan2f(dir_x, dir_z);
        if (azimuth < 0.0f)
            azimuth += 2.0f * kPI;
        azimuth = FastClip(azimuth * kRad2Deg, 0.0f, 360.0f);

        float elevation = atan2f(dir_y, sqrtf(dir_x * dir_x + dir_z * dir_z) + 0.001f) * kRad2Deg;
        float spatialblend = state->spatializerdata->spatialblend;
        float reverbmix = state->spatializerdata->reverbzonemix;

        GetHRTF(0, data->ch[0].h, azimuth, elevation);
        GetHRTF(1, data->ch[1].h, azimuth, elevation);

        // From the FMOD documentation:
        //   A spread angle of 0 makes the stereo sound mono at the point of the 3D emitter.
        //   A spread angle of 90 makes the left part of the stereo sound place itself at 45 degrees to the left and the right part 45 degrees to the right.
        //   A spread angle of 180 makes the left part of the stero sound place itself at 90 degrees to the left and the right part 90 degrees to the right.
        //   A spread angle of 360 makes the stereo sound mono at the opposite speaker location to where the 3D emitter should be located (by moving the left part 180 degrees left and the right part 180 degrees right). So in this case, behind you when the sound should be in front of you!
        // Note that FMOD performs the spreading and panning in one go. We can't do this here due to the way that impulse-based spatialization works, so we perform the spread calculations on the left/right source signals before they enter the convolution processing.
        // That way we can still use it to control how the source signal downmixing takes place.
        float spread = cosf(state->spatializerdata->spread * kPI / 360.0f);
        float spreadmatrix[2] = { 2.0f - spread, spread };

        float* reverb = reverbmixbuffer;
        for (int sampleOffset = 0; sampleOffset < length; sampleOffset += HRTFLEN)
        {
            for (int c = 0; c < 2; c++)
            {
                // stereopan is in the [-1; 1] range, this acts the way fmod does it for stereo
                float stereopan = 1.0f - ((c == 0) ? FastMax(0.0f, state->spatializerdata->stereopan) : FastMax(0.0f, -state->spatializerdata->stereopan));

                InstanceChannel& ch = data->ch[c];

                for (int n = 0; n < HRTFLEN; n++)
                {
                    float left  = inbuffer[n * 2];
                    float right = inbuffer[n * 2 + 1];
                    ch.buffer[n] = ch.buffer[n + HRTFLEN];
                    ch.buffer[n + HRTFLEN] = left * spreadmatrix[c] + right * spreadmatrix[1 - c];
                }

                for (int n = 0; n < HRTFLEN * 2; n++)
                {
                    ch.x[n].re = ch.buffer[n];
                    ch.x[n].im = 0.0f;
                }

                FFT::Forward(ch.x, HRTFLEN * 2, false);

                for (int n = 0; n < HRTFLEN * 2; n++)
                    UnityComplexNumber::Mul<float, float, float>(ch.x[n], ch.h[n], ch.y[n]);

                FFT::Backward(ch.y, HRTFLEN * 2, false);

                for (int n = 0; n < HRTFLEN; n++)
                {
                    float s = inbuffer[n * 2 + c] * stereopan;
                    float y = s + (ch.y[n].re * GAINCORRECTION - s) * spatialblend;
                    outbuffer[n * 2 + c] = y;
                    reverb[n * 2 + c] += y * reverbmix;
                }
            }

            inbuffer += HRTFLEN * 2;
            outbuffer += HRTFLEN * 2;
            reverb += HRTFLEN * 2;
        }

        return UNITY_AUDIODSP_OK;
    }